

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O1

IceTImage icetDrawFrame(IceTDouble *projection_matrix,IceTDouble *modelview_matrix,
                       IceTFloat *background_color)

{
  int *piVar1;
  byte bVar2;
  long lVar3;
  IceTInt *pIVar4;
  IceTBoolean IVar5;
  int iVar6;
  IceTSizeType IVar7;
  IceTSizeType IVar8;
  IceTEnum IVar9;
  IceTImage IVar10;
  IceTInt *pIVar11;
  ulong extraout_RAX;
  undefined7 extraout_var;
  ulong extraout_RAX_00;
  IceTBoolean *pIVar12;
  IceTDouble *pIVar13;
  IceTDouble *pIVar14;
  int *piVar15;
  IceTBoolean *sendbuf;
  IceTUByte *pIVar16;
  IceTFloat *pIVar17;
  float *pfVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  IceTInt IVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  double dVar29;
  int iVar30;
  IceTDouble *out;
  bool bVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  float fVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  IceTInt num_tiles;
  IceTInt global_viewport [4];
  IceTInt frame_count;
  IceTInt num_bounding_verts;
  IceTDouble buf_read_time;
  IceTDouble render_time;
  IceTDouble total_time;
  IceTDouble zfar;
  IceTInt num_bounding_verts_1;
  IceTInt local_34c;
  double local_348;
  double local_340;
  uint local_338;
  int local_334;
  IceTInt *local_330;
  undefined4 local_324;
  IceTBoolean *local_320;
  int *local_318;
  uint local_30c;
  float *local_308;
  IceTInt *local_300;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  IceTInt *local_2e8;
  uint local_2e0;
  uint local_2dc;
  double local_2d8;
  IceTInt *local_2d0;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  IceTDouble local_2a8;
  undefined8 local_2a0;
  undefined8 local_238;
  IceTDouble local_1b8 [16];
  IceTDouble local_138 [5];
  double local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  double local_d8;
  double local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  uint local_b8 [34];
  
  icetGetBooleanv(0x80,(IceTBoolean *)&local_238);
  if ((IceTBoolean)local_238 != '\0') {
    icetRaiseDiagnostic("Recursive frame draw detected.",0xfffffffb,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                        ,0x30d);
    IVar10 = icetImageNull();
    return (IceTImage)IVar10.opaque_internals;
  }
  icetStateResetTiming();
  icetTimingDrawFrameBegin();
  icetStateSetDoublev(0x81,0x10,projection_matrix);
  icetStateSetDoublev(0x82,0x10,modelview_matrix);
  pIVar11 = icetUnsafeStateGetInteger(0x28);
  uVar25 = (uint)((float)*background_color * 255.0);
  uVar28 = (uint)((float)background_color[1] * 255.0);
  uVar22 = (uint)((float)background_color[2] * 255.0);
  uVar27 = (uint)((float)background_color[3] * 255.0);
  local_30c = uVar22;
  local_2e0 = uVar28;
  local_2dc = uVar25;
  if (*pIVar11 == 0x302) {
    icetStateSetFloatv(5,4,black);
    icetStateSetInteger(6,0);
    icetGetIntegerv(0x1b,(IceTInt *)&local_238);
    uVar21 = extraout_RAX;
    if ((-1 < (int)(uint)local_238) &&
       (uVar22 = (uVar28 & 0xff) << 8 | (local_30c & 0xff) << 0x10 | uVar27 << 0x18,
       uVar21 = (ulong)uVar22, (uVar25 & 0xff) != 0 || uVar22 != 0)) {
      IVar5 = icetIsEnabled(0x143);
      uVar21 = CONCAT71(extraout_var,IVar5);
      if (IVar5 != '\0') {
        local_324 = 0;
        goto LAB_0010ccf9;
      }
    }
  }
  else {
    icetStateSetFloatv(5,4,background_color);
    icetStateSetInteger(6,uVar25 & 0xff |
                          (uVar28 & 0xff) << 8 | (uVar22 & 0xff) << 0x10 | uVar27 << 0x18);
    uVar21 = extraout_RAX_00;
  }
  local_324 = (undefined4)CONCAT71((int7)(uVar21 >> 8),1);
LAB_0010ccf9:
  icetGetIntegerv(0x2e,&local_2c4);
  local_2c4 = local_2c4 + 1;
  icetStateSetIntegerv(0x2e,1,&local_2c4);
  icetGetIntegerv(0x23,&local_2c0);
  icetGetIntegerv(0x10,&local_334);
  local_318 = (int *)icetGetStateBuffer(0x181,local_334 << 2);
  pIVar12 = (IceTBoolean *)icetGetStateBuffer(0x182,local_334);
  local_338 = uVar27;
  local_320 = pIVar12;
  local_308 = (float *)background_color;
  if (local_2c0 < 1) {
    if (0 < local_334) {
      lVar24 = 0;
      do {
        local_318[lVar24] = (int)lVar24;
        pIVar12[lVar24] = '\x01';
        lVar24 = lVar24 + 1;
      } while (lVar24 < local_334);
    }
    icetGetIntegerv(0x12,(IceTInt *)&local_2b8);
    local_1b8[0] = -1.0;
    local_138[0] = 1.0;
    local_34c = local_334;
  }
  else {
    icetGetIntegerv(0x12,&local_2f8);
    icetGetDoublev(0x81,(IceTDouble *)&local_2b8);
    icetGetDoublev(0x82,local_1b8);
    local_138[0] = (IceTDouble)(double)local_2f0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    local_110 = (double)local_2ec;
    local_138[3] = 0.0;
    local_138[4] = 0.0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_e8 = 0x4000000000000000;
    local_e0 = 0;
    local_d8 = (double)local_2f8 + (double)local_2f8 + (double)local_138[0];
    local_d0 = (double)local_2f4 + (double)local_2f4 + local_110;
    local_c8 = 0;
    local_c0 = 0x4000000000000000;
    icetMatrixMultiply((IceTDouble *)local_b8,(IceTDouble *)&local_2b8,local_1b8);
    icetMatrixMultiply((IceTDouble *)&local_238,local_138,(IceTDouble *)local_b8);
    icetGetIntegerv(0x23,(IceTInt *)local_b8);
    pIVar13 = (IceTDouble *)icetGetStateBuffer(0x180,local_b8[0] << 5);
    pIVar14 = icetUnsafeStateGetDouble(0x22);
    if (0 < (int)local_b8[0]) {
      pIVar14 = pIVar14 + 2;
      lVar24 = 0;
      out = pIVar13;
      do {
        local_2b8 = pIVar14[-2];
        uStack_2b0 = pIVar14[-1];
        local_2a8 = *pIVar14;
        local_2a0 = 0x3ff0000000000000;
        icetMatrixVectorMultiply(out,(IceTDouble *)&local_238,(IceTDouble *)&local_2b8);
        lVar24 = lVar24 + 1;
        out = out + 4;
        pIVar14 = pIVar14 + 3;
      } while (lVar24 < (int)local_b8[0]);
    }
    background_color = (IceTFloat *)local_308;
    piVar15 = local_318;
    pIVar12 = local_320;
    uVar27 = local_338;
    local_2e8 = (IceTInt *)(double)local_2f8;
    local_330 = (IceTInt *)(double)(local_2f8 + local_2f0);
    local_340 = (double)local_2f4;
    local_348 = (double)(local_2f4 + local_2ec);
    local_1b8[0] = 1.0;
    local_138[0] = -1.0;
    local_300 = local_2e8;
    local_2d0 = local_330;
    local_2d8 = local_348;
    dVar29 = local_340;
    if (0 < (int)local_b8[0]) {
      uVar21 = 0;
      dVar35 = -1.0;
      dVar36 = 1.0;
      do {
        if (0.0 <= (double)pIVar13[uVar21 * 4 + 2] + (double)pIVar13[uVar21 * 4 + 3]) {
          dVar37 = 1.0 / (double)pIVar13[uVar21 * 4 + 3];
          pIVar11 = (IceTInt *)((double)pIVar13[uVar21 * 4] * dVar37);
          dVar38 = (double)pIVar13[uVar21 * 4 + 2] * dVar37;
          dVar37 = dVar37 * (double)pIVar13[uVar21 * 4 + 1];
          if (dVar38 < dVar36) {
            dVar36 = dVar38;
            local_1b8[0] = (IceTDouble)dVar38;
          }
          pIVar4 = pIVar11;
          if ((double)local_2d0 <= (double)pIVar11) {
            pIVar4 = local_2d0;
          }
          local_2d0 = pIVar4;
          if ((double)pIVar11 <= (double)local_300) {
            pIVar11 = local_300;
          }
          dVar39 = dVar37;
          if (local_2d8 <= dVar37) {
            dVar39 = local_2d8;
          }
          if (dVar37 <= dVar29) {
            dVar37 = dVar29;
          }
          local_300 = pIVar11;
          local_2d8 = dVar39;
          dVar29 = dVar37;
          if (dVar35 < dVar38) {
            dVar35 = dVar38;
            local_138[0] = (IceTDouble)dVar38;
          }
        }
        else {
          lVar24 = 0;
          do {
            dVar37 = *(double *)((long)pIVar13 + lVar24 + 0x10);
            dVar38 = *(double *)((long)pIVar13 + lVar24 + 0x18);
            dVar39 = dVar37 + dVar38;
            if (0.0 <= dVar39) {
              dVar39 = dVar39 / (((dVar37 - (double)pIVar13[uVar21 * 4 + 2]) + dVar38) -
                                (double)pIVar13[uVar21 * 4 + 3]);
              dVar37 = 1.0 / (((double)pIVar13[uVar21 * 4 + 3] - dVar38) * dVar39 + dVar38);
              dVar36 = *(double *)((long)pIVar13 + lVar24 + 8);
              pIVar11 = (IceTInt *)
                        ((((double)pIVar13[uVar21 * 4] - *(double *)((long)pIVar13 + lVar24)) *
                          dVar39 + *(double *)((long)pIVar13 + lVar24)) * dVar37);
              dVar37 = (((double)pIVar13[uVar21 * 4 + 1] - dVar36) * dVar39 + dVar36) * dVar37;
              pIVar4 = pIVar11;
              if ((double)local_2d0 <= (double)pIVar11) {
                pIVar4 = local_2d0;
              }
              local_2d0 = pIVar4;
              if ((double)pIVar11 <= (double)local_300) {
                pIVar11 = local_300;
              }
              local_300 = pIVar11;
              dVar36 = dVar37;
              if (local_2d8 <= dVar37) {
                dVar36 = local_2d8;
              }
              local_2d8 = dVar36;
              if (dVar37 <= dVar29) {
                dVar37 = dVar29;
              }
              dVar29 = dVar37;
              local_1b8[0] = -1.0;
              dVar36 = -1.0;
            }
            lVar24 = lVar24 + 0x20;
          } while ((ulong)local_b8[0] << 5 != lVar24);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != local_b8[0]);
    }
    if ((double)local_1b8[0] < -1.0) {
      local_1b8[0] = -1.0;
    }
    if (1.0 < (double)local_138[0]) {
      local_138[0] = 1.0;
    }
    dVar29 = ceil(dVar29);
    uVar32 = SUB84(local_348,0);
    uVar33 = (undefined4)((ulong)local_348 >> 0x20);
    if (dVar29 <= local_348) {
      uVar32 = SUB84(dVar29,0);
      uVar33 = (undefined4)((ulong)dVar29 >> 0x20);
    }
    local_348 = (double)CONCAT44(uVar33,uVar32);
    dVar29 = floor(local_2d8);
    uVar32 = SUB84(local_340,0);
    uVar33 = (undefined4)((ulong)local_340 >> 0x20);
    if (local_340 <= dVar29) {
      uVar32 = SUB84(dVar29,0);
      uVar33 = (undefined4)((ulong)dVar29 >> 0x20);
    }
    local_340 = (double)CONCAT44(uVar33,uVar32);
    dVar29 = ceil((double)local_300);
    uVar32 = SUB84(local_330,0);
    uVar33 = (undefined4)((ulong)local_330 >> 0x20);
    if (dVar29 <= (double)local_330) {
      uVar32 = SUB84(dVar29,0);
      uVar33 = (undefined4)((ulong)dVar29 >> 0x20);
    }
    local_330 = (IceTInt *)CONCAT44(uVar33,uVar32);
    dVar29 = floor((double)local_2d0);
    uVar32 = SUB84(local_2e8,0);
    uVar33 = (undefined4)((ulong)local_2e8 >> 0x20);
    if ((double)local_2e8 <= dVar29) {
      uVar32 = SUB84(dVar29,0);
      uVar33 = (undefined4)((ulong)dVar29 >> 0x20);
    }
    local_2b8 = (IceTDouble)CONCAT44((int)local_340,(int)(double)CONCAT44(uVar33,uVar32));
    uStack_2b0 = (IceTDouble)
                 CONCAT44((int)(local_348 - local_340),
                          (int)((double)local_330 - (double)CONCAT44(uVar33,uVar32)));
    drawDetermineContainedTiles
              ((IceTInt *)&local_2b8,local_1b8[0],local_138[0],piVar15,pIVar12,&local_34c);
  }
  icetGetIntegerv(2,(IceTInt *)local_b8);
  icetGetIntegerv(3,&local_2f8);
  local_2e8 = icetUnsafeStateGetInteger(0x1a);
  icetGetIntegerv(0x2d,(IceTInt *)&local_238);
  if (1 < (int)(uint)local_238) {
    piVar15 = (int *)icetGetStateBuffer(0x183,local_2f8 << 2);
    icetGetIntegerv(0x2c,piVar15);
    piVar1 = local_318;
    uVar21 = (ulong)(uint)local_238;
    if ((int)(uint)local_238 < local_34c) {
      if (1 < (int)(uint)local_238) {
        iVar20 = 2;
        do {
          iVar30 = uStack_2b0._4_4_;
          iVar6 = iVar20;
          do {
            iVar20 = iVar6;
            iVar6 = iVar20 + 1;
          } while ((IceTSizeType)uVar21 % iVar20 != 0);
          local_348 = (double)CONCAT44(local_348._4_4_,(int)uStack_2b0);
          lVar24 = (ulong)((int)uStack_2b0 < uStack_2b0._4_4_) * 4;
          iVar26 = *(int *)((long)&uStack_2b0 + (ulong)((int)uStack_2b0 < uStack_2b0._4_4_) * 4) /
                   iVar20;
          iVar6 = icetFindMyRankInGroup(piVar15,(IceTSizeType)uVar21);
          lVar3 = (long)(int)(uint)local_238;
          local_238._0_4_ = (uint)(lVar3 / (long)iVar20);
          uVar21 = lVar3 / (long)iVar20 & 0xffffffff;
          iVar6 = iVar6 / (int)(uint)local_238;
          iVar19 = iVar26;
          if (iVar6 + 2 == iVar20 + 1) {
            iVar19 = *(int *)((long)&uStack_2b0 + lVar24) - iVar6 * iVar26;
          }
          piVar15 = piVar15 + (int)(iVar6 * (uint)local_238);
          *(int *)((long)&uStack_2b0 + lVar24) = iVar19;
          piVar1 = (int *)((long)&local_2b8 + (ulong)(local_348._0_4_ < iVar30) * 4);
          *piVar1 = *piVar1 + iVar26 * iVar6;
        } while (iVar20 <= (int)(uint)local_238);
      }
      pIVar12 = local_320;
      drawDetermineContainedTiles((IceTInt *)&local_2b8,0.0,0.0,local_318,local_320,&local_34c);
      background_color = (IceTFloat *)local_308;
      uVar27 = local_338;
    }
    else {
      iVar6 = 0;
      iVar20 = 0;
      local_340 = 2.12199579047121e-314;
      IVar23 = local_34c;
      iVar30 = -1;
      local_300 = piVar15;
      do {
        if (IVar23 <= iVar6) break;
        local_330 = (IceTInt *)CONCAT44(local_330._4_4_,IVar23);
        local_348 = (double)CONCAT44(local_348._4_4_,iVar30);
        uVar27 = piVar1[iVar6];
        uVar22 = icetFindRankInGroup(piVar15,(uint)local_238,local_2e8[(int)uVar27]);
        if ((int)uVar22 < 0) {
          iVar6 = iVar6 + 1;
          IVar23 = (int)local_330;
        }
        else {
          bVar31 = piVar15[uVar22] == local_b8[0];
          uVar32 = local_348._0_4_;
          if (bVar31) {
            uVar32 = 0;
          }
          local_348 = (double)CONCAT44(local_348._4_4_,uVar32);
          if (bVar31) {
            iVar20 = 1;
          }
          local_340 = (double)((ulong)local_340 & 0xffffffff);
          if (bVar31) {
            local_340 = (double)(ulong)uVar27;
          }
          piVar1[iVar6] = piVar1[(long)(int)local_330 + -1];
          lVar24 = (long)(int)(uint)local_238;
          local_238._0_4_ = (uint)local_238 - 1;
          piVar15[uVar22] = piVar15[lVar24 + -1];
          IVar23 = (int)local_330 + -1;
        }
        iVar30 = local_348._0_4_;
      } while ((int)uVar22 < 0);
      background_color = (IceTFloat *)local_308;
      dVar29 = local_340;
      if ((0 < IVar23) && (0 < (long)(int)(uint)local_238)) {
        lVar24 = 0;
        iVar6 = 0;
        iVar19 = 0;
        do {
          bVar31 = IVar23 <= iVar6;
          if (IVar23 <= iVar6) {
            iVar6 = 0;
          }
          iVar26 = (uint)(SUB84(dVar29,0) == piVar1[iVar6]) + iVar20;
          iVar20 = iVar19 + (uint)bVar31;
          iVar19 = iVar19 + (uint)bVar31;
          iVar20 = iVar20 + 1;
          if (local_300[lVar24] != local_b8[0]) {
            iVar20 = iVar26;
          }
          dVar29 = (double)((ulong)dVar29 & 0xffffffff);
          if (local_300[lVar24] == local_b8[0]) {
            dVar29 = (double)(ulong)(uint)piVar1[iVar6];
            iVar30 = iVar19;
          }
          lVar24 = lVar24 + 1;
          iVar6 = iVar6 + 1;
        } while ((int)(uint)local_238 != lVar24);
      }
      iVar6 = SUB84(dVar29,0);
      if (iVar6 < 0) {
        local_34c = 0;
        local_2b8 = -NAN;
        uStack_2b0 = 0.0;
      }
      else {
        local_34c = IVar23;
        pIVar11 = icetUnsafeStateGetInteger(0x11);
        uVar21 = (ulong)(uint)(iVar6 * 4);
        iVar19 = pIVar11[uVar21 + 2] / iVar20;
        local_34c = 1;
        *piVar1 = iVar6;
        local_2b8 = (IceTDouble)CONCAT44(pIVar11[uVar21 + 1],pIVar11[uVar21] + iVar19 * iVar30);
        if (iVar30 == iVar20 + -1) {
          iVar19 = pIVar11[uVar21 + 2] - iVar19 * iVar30;
        }
        uStack_2b0 = (IceTDouble)CONCAT44(pIVar11[uVar21 + 3],iVar19);
      }
      pIVar12 = local_320;
      uVar27 = local_338;
      icetGetIntegerv(0x10,&local_2bc);
      if (0 < (long)local_2bc) {
        uVar21 = 0;
        do {
          pIVar12[uVar21] = ((ulong)dVar29 & 0xffffffff) == uVar21;
          uVar21 = uVar21 + 1;
        } while ((long)local_2bc != uVar21);
      }
    }
  }
  icetStateSetIntegerv(0x83,4,(IceTInt *)&local_2b8);
  icetStateSetDoublev(0x84,1,local_1b8);
  icetStateSetDoublev(0x85,1,local_138);
  IVar23 = local_34c;
  icetStateSetInteger(0x86,local_34c);
  icetStateSetIntegerv(0x87,IVar23,local_318);
  icetStateSetBooleanv(0x88,local_334,pIVar12);
  icetGetEnumv(0x24,(IceTEnum *)local_138);
  if (local_138[0]._0_4_ != 0x6002) {
    icetGetIntegerv(3,(IceTInt *)&local_238);
    icetGetIntegerv(0x10,(IceTInt *)&local_2b8);
    pIVar12 = icetStateAllocateBoolean(0x89,(uint)local_238 * (IceTEnum)local_2b8);
    sendbuf = icetUnsafeStateGetBoolean(0x88);
    icetCommAllgather(sendbuf,(IceTEnum)local_2b8,0x8001,pIVar12);
    pIVar11 = icetStateAllocateInteger(0x8a,(IceTEnum)local_2b8);
    local_1b8[0] = (IceTDouble)((ulong)local_1b8[0] & 0xffffffff00000000);
    if (0 < (int)(IceTEnum)local_2b8) {
      lVar24 = 0;
      do {
        pIVar11[lVar24] = 0;
        if (0 < (int)(uint)local_238) {
          iVar20 = 0;
          do {
            if (pIVar12[(int)((IceTEnum)local_2b8 * iVar20 + (int)lVar24)] != '\0') {
              pIVar11[lVar24] = pIVar11[lVar24] + 1;
            }
            iVar20 = iVar20 + 1;
          } while (iVar20 < (int)(uint)local_238);
        }
        local_1b8[0] = (IceTDouble)CONCAT44(local_1b8[0]._4_4_,local_1b8[0]._0_4_ + pIVar11[lVar24])
        ;
        lVar24 = lVar24 + 1;
      } while (lVar24 < (int)(IceTEnum)local_2b8);
    }
    icetStateSetIntegerv(0x8b,1,(IceTInt *)local_1b8);
  }
  icetGetIntegerv(0x1b,(IceTInt *)&local_238);
  if ((int)(uint)local_238 < 0) {
    IVar23 = 0;
    uVar22 = 0xffffffff;
  }
  else {
    pIVar11 = icetUnsafeStateGetInteger(0x11);
    IVar23 = pIVar11[(int)((uint)local_238 * 4 | 3)] * pIVar11[(long)(int)(uint)local_238 * 4 + 2];
    uVar22 = (uint)local_238;
  }
  icetStateSetInteger(0x8c,uVar22);
  icetStateSetInteger(0x8d,0);
  icetStateSetInteger(0x8e,IVar23);
  icetGetPointerv(0x60,(IceTVoid **)&local_238);
  if (CONCAT44(local_238._4_4_,(uint)local_238) == 0) {
    icetRaiseDiagnostic("Drawing function not set.  Call icetDrawCallback.",0xfffffffb,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                        ,0x2ad);
    IVar10 = icetImageNull();
  }
  else {
    icetStateSetBoolean(0x80,'\x01');
    icetGetEnumv(0x24,(IceTEnum *)&local_2b8);
    IVar10 = icetInvokeStrategy((IceTEnum)local_2b8);
    icetStateSetBoolean(0x80,'\0');
    icetGetIntegerv(0x8c,(IceTInt *)local_138);
    icetGetIntegerv(0x1b,(IceTInt *)local_1b8);
    if ((local_138[0]._0_4_ != local_1b8[0]._0_4_) && (IVar5 = icetIsEnabled(0x146), IVar5 != '\0'))
    {
      icetRaiseDiagnostic("Got unexpected tile from strategy.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                          ,0x2bf);
    }
    if (-1 < local_138[0]._0_4_) {
      pIVar11 = icetUnsafeStateGetInteger(0x11);
      lVar24 = (long)local_138[0]._0_4_;
      iVar20 = pIVar11[lVar24 * 4 + 2];
      IVar7 = icetImageGetWidth(IVar10);
      if ((iVar20 != IVar7) ||
         (iVar20 = pIVar11[lVar24 * 4 + 3], IVar7 = icetImageGetHeight(IVar10), iVar20 != IVar7)) {
        icetGetIntegerv(0x8d,(IceTInt *)local_b8);
        icetGetIntegerv(0x8e,&local_2f8);
        icetRaiseDiagnostic("Got unexpected image size from strategy.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                            ,0x2d2);
      }
    }
    icetStateCheckMemory();
  }
  if ((char)local_324 == '\0') {
    IVar7 = icetImageGetWidth(IVar10);
    IVar8 = icetImageGetHeight(IVar10);
    iVar20 = IVar8 * IVar7;
    IVar9 = icetImageGetColorFormat(IVar10);
    icetTimingBlendBegin();
    if (IVar9 == 0xc002) {
      pIVar17 = icetImageGetColorf(IVar10);
      if (0 < iVar20) {
        pfVar18 = (float *)(pIVar17 + 3);
        do {
          fVar34 = 1.0 - *pfVar18;
          pfVar18[-3] = (float)*background_color * fVar34 + pfVar18[-3];
          pfVar18[-2] = ((float *)background_color)[1] * fVar34 + pfVar18[-2];
          pfVar18[-1] = ((float *)background_color)[2] * fVar34 + pfVar18[-1];
          *pfVar18 = fVar34 * ((float *)background_color)[3] + *pfVar18;
          pfVar18 = pfVar18 + 4;
          iVar20 = iVar20 + -1;
        } while (iVar20 != 0);
      }
    }
    else if (IVar9 == 0xc001) {
      pIVar16 = icetImageGetColorub(IVar10);
      if (0 < iVar20) {
        lVar24 = 0;
        do {
          bVar2 = pIVar16[lVar24 * 4 + 3];
          uVar22 = bVar2 ^ 0xff;
          pIVar16[lVar24 * 4] =
               pIVar16[lVar24 * 4] +
               (char)((ulong)(uVar22 * (local_2dc & 0xff)) * 0x1010102 >> 0x20);
          pIVar16[lVar24 * 4 + 1] =
               pIVar16[lVar24 * 4 + 1] +
               (char)((ulong)(uVar22 * (local_2e0 & 0xff)) * 0x1010102 >> 0x20);
          pIVar16[lVar24 * 4 + 2] =
               pIVar16[lVar24 * 4 + 2] +
               (char)((ulong)(uVar22 * (local_30c & 0xff)) * 0x1010102 >> 0x20);
          pIVar16[lVar24 * 4 + 3] =
               (char)((ulong)(uVar22 * (uVar27 & 0xff)) * 0x1010102 >> 0x20) + bVar2;
          lVar24 = lVar24 + 1;
        } while (iVar20 != (int)lVar24);
      }
    }
    else {
      icetRaiseDiagnostic("Encountered invalid color buffer type with color blending.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                          ,0x2f3);
    }
    icetTimingBlendEnd();
  }
  icetGetDoublev(0xc1,(IceTDouble *)&local_238);
  icetGetDoublev(0xc2,(IceTDouble *)&local_2b8);
  icetTimingDrawFrameEnd();
  icetGetDoublev(200,local_1b8);
  icetStateSetDouble(0xc6,(IceTDouble)
                          (((double)local_1b8[0] - (double)CONCAT44(local_238._4_4_,(uint)local_238)
                           ) - (double)local_2b8));
  icetStateSetDouble(0xc3,0.0);
  icetStateCheckMemory();
  return (IceTImage)IVar10.opaque_internals;
}

Assistant:

IceTImage icetDrawFrame(const IceTDouble *projection_matrix,
                        const IceTDouble *modelview_matrix,
                        const IceTFloat *background_color)
{
    IceTInt frame_count;
    IceTImage image;
    IceTDouble render_time;
    IceTDouble buf_read_time;
    IceTDouble compose_time;
    IceTDouble total_time;
    IceTUInt background_color_word;
    IceTBoolean need_color_correction;

    icetRaiseDebug("In icetDrawFrame");

    {
        IceTBoolean isDrawing;
        icetGetBooleanv(ICET_IS_DRAWING_FRAME, &isDrawing);
        if (isDrawing) {
            icetRaiseError("Recursive frame draw detected.",
                           ICET_INVALID_OPERATION);
            return icetImageNull();
        }
    }

    icetStateResetTiming();
    icetTimingDrawFrameBegin();

    icetStateSetDoublev(ICET_PROJECTION_MATRIX, 16, projection_matrix);
    icetStateSetDoublev(ICET_MODELVIEW_MATRIX, 16, modelview_matrix);

    drawUseBackgroundColor(background_color,
                           &background_color_word,
                           &need_color_correction);

    icetGetIntegerv(ICET_FRAME_COUNT, &frame_count);
    frame_count++;
    icetStateSetIntegerv(ICET_FRAME_COUNT, 1, &frame_count);

    drawProjectBounds();

    {
        IceTEnum strategy;
        icetGetEnumv(ICET_STRATEGY, &strategy);

        /* drawCollectTileInformation does an allgather to get information
         * about the tiles in other processes.  These variables are
         * ICET_ALL_CONTAINED_TILES_MASKS, ICET_TILE_CONTRIB_COUNTS, and
         * ICET_TOTAL_IMAGE_COUNT.  However, the sequential strategy ignores
         * this information and just uses all processes for all tiles.  When
         * compositing a single tile, this is a fine strategy and we can save
         * a significant proportion of frame time by skipping this step. */
        if (strategy != ICET_STRATEGY_SEQUENTIAL) {
            drawCollectTileInformation();
        }
    }

    {
        IceTInt tile_displayed;
        icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);

        if (tile_displayed >= 0) {
            const IceTInt *tile_viewports
                = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
            IceTInt num_pixels = (  tile_viewports[4*tile_displayed+2]
                                  * tile_viewports[4*tile_displayed+3] );
            icetStateSetInteger(ICET_VALID_PIXELS_TILE, tile_displayed);
            icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
            icetStateSetInteger(ICET_VALID_PIXELS_NUM, num_pixels);
        } else {
            icetStateSetInteger(ICET_VALID_PIXELS_TILE, -1);
            icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
            icetStateSetInteger(ICET_VALID_PIXELS_NUM, 0);
        }
    }

    image = drawInvokeStrategy();

    /* Correct background color where applicable. */
    if (need_color_correction) {
        drawCorrectBackground(image, background_color, background_color_word);
    }

    /* Calculate times. */
    icetGetDoublev(ICET_RENDER_TIME, &render_time);
    icetGetDoublev(ICET_BUFFER_READ_TIME, &buf_read_time);

    icetTimingDrawFrameEnd();

    icetGetDoublev(ICET_TOTAL_DRAW_TIME, &total_time);

    compose_time = total_time - render_time - buf_read_time;
    icetStateSetDouble(ICET_COMPOSITE_TIME, compose_time);

    icetStateSetDouble(ICET_BUFFER_WRITE_TIME, 0.0);

    icetStateCheckMemory();

    return image;
}